

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> * __thiscall
cmGeneratorTarget::GetSourceDepends(cmGeneratorTarget *this,cmSourceFile *sf)

{
  const_iterator cVar1;
  _Base_ptr *pp_Var2;
  cmSourceFile *local_10;
  
  local_10 = sf;
  cVar1 = std::
          _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
          ::find(&(this->SourceDepends)._M_t,&local_10);
  pp_Var2 = (_Base_ptr *)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->SourceDepends)._M_t._M_impl.super__Rb_tree_header)
  {
    pp_Var2 = &cVar1._M_node[1]._M_parent;
  }
  return (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)pp_Var2;
}

Assistant:

std::vector<cmSourceFile*> const* cmGeneratorTarget::GetSourceDepends(
  cmSourceFile const* sf) const
{
  SourceEntriesType::const_iterator i = this->SourceDepends.find(sf);
  if (i != this->SourceDepends.end()) {
    return &i->second.Depends;
  }
  return nullptr;
}